

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O0

string * __thiscall
vkt::tessellation::(anonymous_namespace)::IOBlock::declare_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  int iVar1;
  ostream *poVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference name;
  DeclareVariable local_1e0;
  int local_1a0;
  int i;
  ostringstream local_190 [8];
  ostringstream buf;
  IOBlock *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,(string *)((long)this + 8));
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"{\n");
  local_1a0 = 0;
  while( true ) {
    iVar1 = local_1a0;
    sVar3 = std::
            vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
            ::size((vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                    *)((long)this + 0x48));
    if ((int)sVar3 <= iVar1) break;
    poVar2 = std::operator<<((ostream *)local_190,"\t");
    pvVar4 = std::
             vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
             ::operator[]((vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                           *)((long)this + 0x48),(long)local_1a0);
    name = std::
           vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
           ::operator[]((vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                         *)((long)this + 0x48),(long)local_1a0);
    glu::declare(&local_1e0,&pvVar4->type,&name->name,0);
    poVar2 = glu::decl::operator<<(poVar2,&local_1e0);
    std::operator<<(poVar2,";\n");
    glu::decl::DeclareVariable::~DeclareVariable(&local_1e0);
    local_1a0 = local_1a0 + 1;
  }
  poVar2 = std::operator<<((ostream *)local_190,"} ");
  poVar2 = std::operator<<(poVar2,(string *)((long)this + 0x28));
  std::operator<<(poVar2,";\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string IOBlock::declare (void) const
{
	std::ostringstream buf;

	buf << m_blockName << "\n"
		<< "{\n";

	for (int i = 0; i < static_cast<int>(m_members.size()); ++i)
		buf << "\t" << glu::declare(m_members[i].type, m_members[i].name) << ";\n";

	buf << "} " << m_interfaceName << ";\n";
	return buf.str();
}